

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::MinMaxState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::MinOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  hugeint_t *idata_00;
  MinMaxState<duckdb::hugeint_t> **states_00;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    if (states->vector_type == FLAT_VECTOR) {
      idata_00 = (hugeint_t *)input->data;
      states_00 = (MinMaxState<duckdb::hugeint_t> **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::MinMaxState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::MinOperation>
                (idata_00,aggr_input_data,states_00,&input->validity,count);
      return;
    }
  }
  else if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      return;
    }
    puVar2 = *(ulong **)states->data;
    uVar3 = *(ulong *)input->data;
    uVar4 = *(ulong *)((long)input->data + 8);
    if ((char)puVar2[2] == '\0') {
      *puVar2 = uVar3;
      puVar2[1] = uVar4;
      *(undefined1 *)(puVar2 + 2) = 1;
      return;
    }
    if (((long)puVar2[1] <= (long)uVar4) && (*puVar2 <= uVar3 || puVar2[1] != uVar4)) {
      return;
    }
    *puVar2 = uVar3;
    puVar2[1] = uVar4;
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_c0);
  Vector::ToUnifiedFormat(states,count,&local_78);
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar5 = (local_c0.sel)->sel_vector;
      psVar6 = (local_78.sel)->sel_vector;
      iVar7 = 0;
      do {
        iVar9 = iVar7;
        if (psVar5 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar5[iVar7];
        }
        iVar8 = iVar7;
        if (psVar6 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar6[iVar7];
        }
        puVar2 = *(ulong **)(local_78.data + iVar8 * 8);
        uVar3 = *(ulong *)(local_c0.data + iVar9 * 0x10);
        uVar4 = *(ulong *)(local_c0.data + iVar9 * 0x10 + 8);
        if ((char)puVar2[2] == '\0') {
          *puVar2 = uVar3;
          puVar2[1] = uVar4;
          *(undefined1 *)(puVar2 + 2) = 1;
        }
        else if (((long)uVar4 < (long)puVar2[1]) || (uVar3 < *puVar2 && puVar2[1] == uVar4)) {
          *puVar2 = uVar3;
          puVar2[1] = uVar4;
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  else if (count != 0) {
    psVar5 = (local_c0.sel)->sel_vector;
    psVar6 = (local_78.sel)->sel_vector;
    iVar7 = 0;
    do {
      iVar9 = iVar7;
      if (psVar5 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar5[iVar7];
      }
      iVar8 = iVar7;
      if (psVar6 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar6[iVar7];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar9 >> 6] >>
           (iVar9 & 0x3f) & 1) != 0) {
        puVar2 = *(ulong **)(local_78.data + iVar8 * 8);
        uVar3 = *(ulong *)(local_c0.data + iVar9 * 0x10);
        uVar4 = *(ulong *)(local_c0.data + iVar9 * 0x10 + 8);
        if ((char)puVar2[2] == '\0') {
          *puVar2 = uVar3;
          puVar2[1] = uVar4;
          *(undefined1 *)(puVar2 + 2) = 1;
        }
        else if (((long)uVar4 < (long)puVar2[1]) || (uVar3 < *puVar2 && puVar2[1] == uVar4)) {
          *puVar2 = uVar3;
          puVar2[1] = uVar4;
        }
      }
      iVar7 = iVar7 + 1;
    } while (count != iVar7);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}